

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int buf_append(buf_t *buf,void *data,unsigned_long len)

{
  int iVar1;
  unsigned_long len_local;
  void *data_local;
  buf_t *buf_local;
  
  if (buf == (buf_t *)0x0) {
    __assert_fail("buf != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/buf.c",0x2a,
                  "int buf_append(buf_t *, void *, unsigned long)");
  }
  if (buf->data == (uchar *)0x0) {
    __assert_fail("buf->data != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/buf.c",0x2b,
                  "int buf_append(buf_t *, void *, unsigned long)");
  }
  if (data == (void *)0x0) {
    __assert_fail("data != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/buf.c",0x2c,
                  "int buf_append(buf_t *, void *, unsigned long)");
  }
  if (len != 0) {
    do {
      if (buf->len + len <= buf->size) {
        memcpy(buf->data + buf->len,data,len);
        buf->len = len + buf->len;
        return 1;
      }
      iVar1 = buf_grow(buf);
    } while (iVar1 != 0);
    return 0;
  }
  __assert_fail("len > 0","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/buf.c",0x2d
                ,"int buf_append(buf_t *, void *, unsigned long)");
}

Assistant:

int buf_append(buf_t *buf, void *data, unsigned long len) {
  assert(buf != NULL);
  assert(buf->data != NULL);
  assert(data != NULL);
  assert(len > 0);

 again:
  if ((buf->len + len) > buf->size) {
    if (!buf_grow(buf))
      return 0;
    else
      goto again;
  }

  memcpy(buf->data + buf->len, data, len);
  buf->len += len;

  return 1;
}